

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjuliancalendar.cpp
# Opt level: O1

YearMonthDay __thiscall QJulianCalendar::julianDayToDate(QJulianCalendar *this,qint64 jd)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  R_conflict20 RVar6;
  YearMonthDay YVar7;
  
  lVar4 = jd * 4;
  uVar5 = lVar4 - 0x690c75;
  if ((long)uVar5 < 0) {
    lVar1 = SUB168(SEXT816(lVar4 + -0x690c74) * SEXT816(-0x4c927c686ebd9737),8) + lVar4 + -0x690c74;
    lVar2 = -(lVar1 >> 0x3f);
    lVar1 = lVar1 >> 10;
    iVar3 = (int)lVar1 + (int)lVar2 + -1;
    uVar5 = lVar4 + -0x690c74 + (lVar1 + lVar2) * -0x5b5 + 0x5b4;
  }
  else {
    iVar3 = (int)(uVar5 / 0x5b5);
    uVar5 = uVar5 % 0x5b5;
  }
  RVar6 = QRomanCalendrical::dayInYearToYmd((int)(uVar5 >> 2));
  YVar7.day = RVar6.day;
  iVar3 = iVar3 + RVar6.year;
  YVar7._0_8_ = RVar6._0_8_ & 0xffffffff00000000 | (ulong)(iVar3 - (uint)(iVar3 < 1));
  return YVar7;
}

Assistant:

QCalendar::YearMonthDay QJulianCalendar::julianDayToDate(qint64 jd) const
{
    const auto year4Day = qDivMod<FourYears>(4 * (jd - JulianBaseJd) - 1);
    // Its remainder changes by 4 per day, except at roughly yearly quotient steps.
    const auto ymd = dayInYearToYmd(qDiv<4>(year4Day.remainder));
    const int y = year4Day.quotient + ymd.year;
    return QCalendar::YearMonthDay(y > 0 ? y : y - 1, ymd.month, ymd.day);
}